

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

QTzTimeZoneCacheEntry * __thiscall
QTzTimeZoneCache::fetchEntry
          (QTzTimeZoneCacheEntry *__return_storage_ptr__,QTzTimeZoneCache *this,QByteArray *ianaId)

{
  QMutex *this_00;
  __pointer_type pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  Data *pDVar5;
  int iVar6;
  int iVar7;
  QTzTimeZoneCacheEntry *object;
  QTzTimeZoneCacheEntry *pQVar8;
  long in_FS_OFFSET;
  bool bVar9;
  __single_object ptr;
  QTzTimeZoneCacheEntry *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_mutex;
  if ((this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar9 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar9) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar9) goto LAB_0040a07a;
  }
  else {
LAB_0040a07a:
    QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
  }
  pQVar8 = QCache<QByteArray,_QTzTimeZoneCacheEntry>::relink(&this->m_cache,ianaId);
  if (pQVar8 != (QTzTimeZoneCacheEntry *)0x0) {
    pDVar2 = (pQVar8->m_tranTimes).d.d;
    (__return_storage_ptr__->m_tranTimes).d.d = pDVar2;
    (__return_storage_ptr__->m_tranTimes).d.ptr = (pQVar8->m_tranTimes).d.ptr;
    (__return_storage_ptr__->m_tranTimes).d.size = (pQVar8->m_tranTimes).d.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           1);
      UNLOCK();
    }
    pDVar3 = (pQVar8->m_tranRules).d.d;
    (__return_storage_ptr__->m_tranRules).d.d = pDVar3;
    (__return_storage_ptr__->m_tranRules).d.ptr = (pQVar8->m_tranRules).d.ptr;
    (__return_storage_ptr__->m_tranRules).d.size = (pQVar8->m_tranRules).d.size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pDVar4 = (pQVar8->m_abbreviations).d.d;
    (__return_storage_ptr__->m_abbreviations).d.d = pDVar4;
    (__return_storage_ptr__->m_abbreviations).d.ptr = (pQVar8->m_abbreviations).d.ptr;
    (__return_storage_ptr__->m_abbreviations).d.size = (pQVar8->m_abbreviations).d.size;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pDVar5 = (pQVar8->m_posixRule).d.d;
    (__return_storage_ptr__->m_posixRule).d.d = pDVar5;
    (__return_storage_ptr__->m_posixRule).d.ptr = (pQVar8->m_posixRule).d.ptr;
    (__return_storage_ptr__->m_posixRule).d.size = (pQVar8->m_posixRule).d.size;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    iVar6 = (pQVar8->m_preZoneRule).stdOffset;
    iVar7 = (pQVar8->m_preZoneRule).dstOffset;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_preZoneRule).dstOffset + 1) =
         *(undefined8 *)((long)&(pQVar8->m_preZoneRule).dstOffset + 1);
    (__return_storage_ptr__->m_preZoneRule).stdOffset = iVar6;
    (__return_storage_ptr__->m_preZoneRule).dstOffset = iVar7;
    goto LAB_0040a282;
  }
  LOCK();
  pQVar1 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,pQVar1);
  }
  *(undefined1 **)&__return_storage_ptr__->m_preZoneRule = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->m_preZoneRule).abbreviationIndex = &DAT_aaaaaaaaaaaaaaaa
  ;
  (__return_storage_ptr__->m_posixRule).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_posixRule).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_abbreviations).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_posixRule).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_abbreviations).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_abbreviations).d.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_tranRules).d.ptr = (QTzTransitionRule *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_tranRules).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_tranTimes).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_tranRules).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_tranTimes).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_tranTimes).d.ptr = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
  findEntry(__return_storage_ptr__,ianaId);
  local_40 = (QTzTimeZoneCacheEntry *)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = (QTzTimeZoneCacheEntry *)operator_new(0x70);
  pDVar2 = (__return_storage_ptr__->m_tranTimes).d.d;
  (local_40->m_tranTimes).d.d = pDVar2;
  (local_40->m_tranTimes).d.ptr = (__return_storage_ptr__->m_tranTimes).d.ptr;
  (local_40->m_tranTimes).d.size = (__return_storage_ptr__->m_tranTimes).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  pDVar3 = (__return_storage_ptr__->m_tranRules).d.d;
  (local_40->m_tranRules).d.d = pDVar3;
  (local_40->m_tranRules).d.ptr = (__return_storage_ptr__->m_tranRules).d.ptr;
  (local_40->m_tranRules).d.size = (__return_storage_ptr__->m_tranRules).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar4 = (__return_storage_ptr__->m_abbreviations).d.d;
  (local_40->m_abbreviations).d.d = pDVar4;
  (local_40->m_abbreviations).d.ptr = (__return_storage_ptr__->m_abbreviations).d.ptr;
  (local_40->m_abbreviations).d.size = (__return_storage_ptr__->m_abbreviations).d.size;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar5 = (__return_storage_ptr__->m_posixRule).d.d;
  (local_40->m_posixRule).d.d = pDVar5;
  (local_40->m_posixRule).d.ptr = (__return_storage_ptr__->m_posixRule).d.ptr;
  (local_40->m_posixRule).d.size = (__return_storage_ptr__->m_posixRule).d.size;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar6 = (__return_storage_ptr__->m_preZoneRule).stdOffset;
  iVar7 = (__return_storage_ptr__->m_preZoneRule).dstOffset;
  *(undefined8 *)((long)&(local_40->m_preZoneRule).dstOffset + 1) =
       *(undefined8 *)((long)&(__return_storage_ptr__->m_preZoneRule).dstOffset + 1);
  (local_40->m_preZoneRule).stdOffset = iVar6;
  (local_40->m_preZoneRule).dstOffset = iVar7;
  if ((this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar9 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar9) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar9) goto LAB_0040a235;
  }
  else {
LAB_0040a235:
    QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
  }
  object = local_40;
  local_40 = (QTzTimeZoneCacheEntry *)0x0;
  QCache<QByteArray,_QTzTimeZoneCacheEntry>::insert(&this->m_cache,ianaId,object,1);
  LOCK();
  pQVar1 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,pQVar1);
  }
  if (local_40 != (QTzTimeZoneCacheEntry *)0x0) {
    std::default_delete<QTzTimeZoneCacheEntry>::operator()
              ((default_delete<QTzTimeZoneCacheEntry> *)&local_40,local_40);
  }
LAB_0040a282:
  if (pQVar8 != (QTzTimeZoneCacheEntry *)0x0) {
    LOCK();
    pQVar1 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
    (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,pQVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTzTimeZoneCacheEntry QTzTimeZoneCache::fetchEntry(const QByteArray &ianaId)
{
    QMutexLocker locker(&m_mutex);

    // search the cache...
    QTzTimeZoneCacheEntry *obj = m_cache.object(ianaId);
    if (obj)
        return *obj;

    // ... or build a new entry from scratch

    locker.unlock(); // don't parse files under mutex lock

    QTzTimeZoneCacheEntry ret = findEntry(ianaId);
    auto ptr = std::make_unique<QTzTimeZoneCacheEntry>(ret);

    locker.relock();
    m_cache.insert(ianaId, ptr.release()); // may overwrite if another thread was faster
    locker.unlock();

    return ret;
}